

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtSwapAdjacent(word *pTruth,int nWords,int iVar)

{
  uint uVar1;
  word wVar2;
  int iVar3;
  byte bVar4;
  word t_1;
  int iStep;
  int i_1;
  word *pLimit;
  uint t;
  uint *pLimitU;
  uint *pTruthU;
  int Shift;
  int i;
  int iVar_local;
  int nWords_local;
  word *pTruth_local;
  
  if (iVar < 5) {
    for (pTruthU._4_4_ = 0; pTruthU._4_4_ < nWords; pTruthU._4_4_ = pTruthU._4_4_ + 1) {
      bVar4 = (byte)(1 << ((byte)iVar & 0x1f));
      pTruth[pTruthU._4_4_] =
           pTruth[pTruthU._4_4_] & Abc_TtSwapAdjacent::s_PMasks[iVar][0] |
           (pTruth[pTruthU._4_4_] & Abc_TtSwapAdjacent::s_PMasks[iVar][1]) << (bVar4 & 0x3f) |
           (pTruth[pTruthU._4_4_] & Abc_TtSwapAdjacent::s_PMasks[iVar][2]) >> (bVar4 & 0x3f);
    }
  }
  else if (iVar == 5) {
    for (pLimitU = (uint *)pTruth; pLimitU < pTruth + nWords; pLimitU = pLimitU + 4) {
      uVar1 = pLimitU[1];
      pLimitU[1] = pLimitU[2];
      pLimitU[2] = uVar1;
    }
  }
  else {
    iVar3 = Abc_TtWordNum(iVar);
    for (_iVar_local = pTruth; _iVar_local < pTruth + nWords;
        _iVar_local = _iVar_local + (iVar3 << 2)) {
      for (t_1._4_4_ = 0; t_1._4_4_ < iVar3; t_1._4_4_ = t_1._4_4_ + 1) {
        wVar2 = _iVar_local[t_1._4_4_ + iVar3];
        _iVar_local[t_1._4_4_ + iVar3] = _iVar_local[t_1._4_4_ + iVar3 * 2];
        _iVar_local[t_1._4_4_ + iVar3 * 2] = wVar2;
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtSwapAdjacent( word * pTruth, int nWords, int iVar )
{
    static word s_PMasks[5][3] = {
        { ABC_CONST(0x9999999999999999), ABC_CONST(0x2222222222222222), ABC_CONST(0x4444444444444444) },
        { ABC_CONST(0xC3C3C3C3C3C3C3C3), ABC_CONST(0x0C0C0C0C0C0C0C0C), ABC_CONST(0x3030303030303030) },
        { ABC_CONST(0xF00FF00FF00FF00F), ABC_CONST(0x00F000F000F000F0), ABC_CONST(0x0F000F000F000F00) },
        { ABC_CONST(0xFF0000FFFF0000FF), ABC_CONST(0x0000FF000000FF00), ABC_CONST(0x00FF000000FF0000) },
        { ABC_CONST(0xFFFF00000000FFFF), ABC_CONST(0x00000000FFFF0000), ABC_CONST(0x0000FFFF00000000) }
    };
    if ( iVar < 5 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & s_PMasks[iVar][0]) | ((pTruth[i] & s_PMasks[iVar][1]) << Shift) | ((pTruth[i] & s_PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar == 5 )
    {
        unsigned * pTruthU = (unsigned *)pTruth;
        unsigned * pLimitU = (unsigned *)(pTruth + nWords);
		for ( ; pTruthU < pLimitU; pTruthU += 4 )
            ABC_SWAP( unsigned, pTruthU[1], pTruthU[2] );
    }
    else // if ( iVar > 5 )
    {
        word * pLimit = pTruth + nWords;
		int i, iStep = Abc_TtWordNum(iVar);
		for ( ; pTruth < pLimit; pTruth += 4*iStep )
			for ( i = 0; i < iStep; i++ )
                ABC_SWAP( word, pTruth[i + iStep], pTruth[i + 2*iStep] );
    }
}